

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

void __thiscall
testing::
Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Action(Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *this,ActionInterface<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *impl)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::ActionInterface<ot::commissioner::Error(std::__cxx11::string_const&,std::__cxx11::string_const&)>*>
            (&_Stack_10,impl);
  (this->fun_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->fun_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->fun_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->fun_).super__Function_base._M_functor + 8) = 0;
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = impl;
  puVar1[1] = _Stack_10._M_pi;
  *(undefined8 **)&(this->fun_).super__Function_base._M_functor = puVar1;
  (this->fun_)._M_invoker =
       std::
       _Function_handler<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_testing::Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::ActionAdapter>
       ::_M_invoke;
  (this->fun_).super__Function_base._M_manager =
       std::
       _Function_handler<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_testing::Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::ActionAdapter>
       ::_M_manager;
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}